

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptor.hpp
# Opt level: O2

iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
* burst::operator|(iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
                   *__return_storage_ptr__,
                  iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>
                  *range,adaptor_compare_forwarder_t<burst::symmetric_difference_t,_std::tuple<std::greater<void>_>_>
                         *forwarder)

{
  undefined1 *local_18;
  iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_*,_std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  *local_10;
  
  local_18 = &forwarder->field_0x1;
  local_10 = range;
  detail::
  apply_impl<burst::symmetric_difference_t&,std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>*,std::vector<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,std::allocator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>>>>&&,std::greater<void>&&>,0ul,1ul>
            (__return_storage_ptr__,(detail *)forwarder,&local_18);
  return __return_storage_ptr__;
}

Assistant:

auto operator | (Range && range, adaptor_compare_forwarder_t<Adaptor, Tuple> forwarder)
    {
        return
            burst::apply
            (
                forwarder.adaptor,
                std::tuple_cat
                (
                    std::forward_as_tuple(std::forward<Range>(range)),
                    forward_tuple(std::move(forwarder.arguments))
                )
            );
    }